

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

Gia_Man_t * Gia_ManEquivReduce(Gia_Man_t *p,int fUseAll,int fDualOut,int fSkipPhase,int fVerbose)

{
  size_t __size;
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Gia_Man_t *pGVar4;
  void *__s;
  Gia_Rpr_t *pGVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  int *piVar9;
  ulong uVar10;
  int iVar11;
  
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    if (p->pSibls != (int *)0x0) {
      uVar1 = p->nObjs;
      __size = (long)(int)uVar1 * 4;
      __s = malloc(__size);
      memset(__s,0xff,__size);
      pGVar5 = (Gia_Rpr_t *)calloc((long)(int)uVar1,4);
      p->pReprs = pGVar5;
      for (lVar6 = 0; lVar6 < (int)uVar1; lVar6 = lVar6 + 1) {
        p->pReprs[lVar6] = (Gia_Rpr_t)((uint)p->pReprs[lVar6] | 0xfffffff);
        uVar1 = p->nObjs;
      }
      uVar8 = 0;
      uVar10 = 0;
      if (0 < (int)uVar1) {
        uVar10 = (ulong)uVar1;
      }
      for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
        iVar11 = p->pSibls[uVar8];
        lVar6 = (long)iVar11;
        if (0 < lVar6) {
          iVar2 = *(int *)((long)__s + lVar6 * 4);
          if (iVar2 == -1) {
            *(int *)((long)__s + lVar6 * 4) = iVar11;
            iVar2 = iVar11;
          }
          *(int *)((long)__s + uVar8 * 4) = iVar2;
        }
      }
      for (lVar6 = 0; lVar6 < (int)uVar1; lVar6 = lVar6 + 1) {
        if (0 < p->pSibls[lVar6]) {
          Gia_ObjSetRepr(p,(int)lVar6,*(int *)((long)__s + lVar6 * 4));
          uVar1 = p->nObjs;
        }
      }
      if (p->pNexts != (int *)0x0) {
        free(p->pNexts);
        p->pNexts = (int *)0x0;
      }
      piVar9 = Gia_ManDeriveNexts(p);
      p->pNexts = piVar9;
      free(__s);
      if (p->pReprs != (Gia_Rpr_t *)0x0) goto LAB_001e5789;
    }
    pcVar7 = "Gia_ManEquivReduce(): Equivalence classes are not available.\n";
  }
  else {
LAB_001e5789:
    if ((fDualOut == 0) || ((p->vCos->nSize - p->nRegs & 1U) == 0)) {
      iVar11 = 0;
      while (((iVar11 < p->nObjs && (pGVar3 = Gia_ManObj(p,iVar11), pGVar3 != (Gia_Obj_t *)0x0)) &&
             (pGVar3 = Gia_ObjReprObj(p,iVar11), pGVar3 == (Gia_Obj_t *)0x0))) {
        iVar11 = iVar11 + 1;
      }
      if (p->nObjs != iVar11) {
        if (fSkipPhase == 0) {
          Gia_ManSetPhase(p);
        }
        if (fDualOut != 0) {
          Gia_ManEquivSetColors(p,fVerbose);
        }
        pGVar4 = Gia_ManStart(p->nObjs);
        pcVar7 = Abc_UtilStrsav(p->pName);
        pGVar4->pName = pcVar7;
        pcVar7 = Abc_UtilStrsav(p->pSpec);
        pGVar4->pSpec = pcVar7;
        Gia_ManFillValue(p);
        p->pObjs->Value = 0;
        iVar11 = 0;
        while ((iVar11 < p->vCis->nSize &&
               (pGVar3 = Gia_ManCi(p,iVar11), pGVar3 != (Gia_Obj_t *)0x0))) {
          uVar1 = Gia_ManAppendCi(pGVar4);
          pGVar3->Value = uVar1;
          iVar11 = iVar11 + 1;
        }
        Gia_ManHashAlloc(pGVar4);
        iVar11 = 0;
        while ((iVar11 < p->vCos->nSize &&
               (pGVar3 = Gia_ManCo(p,iVar11), pGVar3 != (Gia_Obj_t *)0x0))) {
          Gia_ManEquivReduce_rec
                    (pGVar4,p,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff),fUseAll,
                     fDualOut);
          iVar11 = iVar11 + 1;
        }
        iVar11 = 0;
        while ((iVar11 < p->vCos->nSize &&
               (pGVar3 = Gia_ManCo(p,iVar11), pGVar3 != (Gia_Obj_t *)0x0))) {
          iVar2 = Gia_ObjFanin0Copy(pGVar3);
          uVar1 = Gia_ManAppendCo(pGVar4,iVar2);
          pGVar3->Value = uVar1;
          iVar11 = iVar11 + 1;
        }
        Gia_ManHashStop(pGVar4);
        Gia_ManSetRegNum(pGVar4,p->nRegs);
        return pGVar4;
      }
      pGVar4 = Gia_ManDup(p);
      return pGVar4;
    }
    pcVar7 = "Gia_ManEquivReduce(): Dual-output miter should have even number of POs.\n";
  }
  Abc_Print(1,pcVar7);
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Gia_ManEquivReduce( Gia_Man_t * p, int fUseAll, int fDualOut, int fSkipPhase, int fVerbose )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    if ( !p->pReprs && p->pSibls )
    {
        int * pMap = ABC_FALLOC( int, Gia_ManObjNum(p) );
        p->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            Gia_ObjSetRepr( p, i, GIA_VOID );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            if ( p->pSibls[i] > 0 )
            {
                if ( pMap[p->pSibls[i]] == -1 )
                    pMap[p->pSibls[i]] = p->pSibls[i];
                pMap[i] = pMap[p->pSibls[i]];
            }
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            if ( p->pSibls[i] > 0 )
                Gia_ObjSetRepr( p, i, pMap[i] );
        //printf( "Created equivalence classes.\n" );
        ABC_FREE( p->pNexts );
        p->pNexts = Gia_ManDeriveNexts( p );
        ABC_FREE( pMap );
    }
    if ( !p->pReprs )
    {
        Abc_Print( 1, "Gia_ManEquivReduce(): Equivalence classes are not available.\n" );
        return NULL;
    }
    if ( fDualOut && (Gia_ManPoNum(p) & 1) )
    {
        Abc_Print( 1, "Gia_ManEquivReduce(): Dual-output miter should have even number of POs.\n" );
        return NULL;
    }
    // check if there are any equivalences defined
    Gia_ManForEachObj( p, pObj, i )
        if ( Gia_ObjReprObj(p, i) != NULL )
            break;
    if ( i == Gia_ManObjNum(p) )
    {
//        Abc_Print( 1, "Gia_ManEquivReduce(): There are no equivalences to reduce.\n" );
//        return NULL;
        return Gia_ManDup( p );
    }
/*
    if ( !Gia_ManCheckTopoOrder( p ) )
    {
        Abc_Print( 1, "Gia_ManEquivReduce(): AIG is not in a correct topological order.\n" );
        return NULL;
    }
*/
    if ( !fSkipPhase )
        Gia_ManSetPhase( p );
    if ( fDualOut )
        Gia_ManEquivSetColors( p, fVerbose );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManEquivReduce_rec( pNew, p, Gia_ObjFanin0(pObj), fUseAll, fDualOut );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}